

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool SetHasKeys<std::__cxx11::string,char[20],char[11],char[11]>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *set,char (*key) [20],char (*args) [11],char (*args_1) [11])

{
  size_type sVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  key_type *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar2;
  char (*in_stack_ffffffffffffffa0) [11];
  allocator<char> *in_stack_ffffffffffffffa8;
  allocator<char> local_29 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)in_RCX,in_stack_ffffffffffffffa8);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78)
                                      )),in_stack_ffffffffffffff70);
  bVar2 = true;
  if (sVar1 == 0) {
    bVar2 = SetHasKeys<std::__cxx11::string,char[11],char[11]>
                      (in_RCX,(char (*) [11])in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator(local_29);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static inline bool SetHasKeys(const std::set<T>& set, const Tk& key, const Args&... args)
{
    return (set.count(key) != 0) || SetHasKeys(set, args...);
}